

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  Pair *__dest;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  Pair *pPVar11;
  ulong uVar6;
  
  iVar2 = (this->Data).Size;
  uVar3 = (ulong)iVar2;
  __dest = (this->Data).Data;
  uVar6 = uVar3;
  pPVar11 = __dest;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    do {
      uVar5 = uVar6 >> 1;
      uVar7 = uVar5;
      if (pPVar11[uVar5].key < key) {
        uVar7 = ~uVar5 + uVar6;
        pPVar11 = pPVar11 + uVar5 + 1;
      }
      uVar6 = uVar7;
    } while (uVar7 != 0);
  }
  if ((pPVar11 == __dest + uVar3) || (pPVar11->key != key)) {
    lVar10 = (long)pPVar11 - (long)__dest;
    if (iVar2 == (this->Data).Capacity) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar4) {
        iVar9 = iVar4;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (Pair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData);
      pPVar11 = (this->Data).Data;
      if (pPVar11 != (Pair *)0x0) {
        memcpy(__dest,pPVar11,(long)(this->Data).Size << 4);
        pPVar11 = (this->Data).Data;
        if ((pPVar11 != (Pair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pPVar11,GImAllocatorUserData);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar9;
      uVar3 = (ulong)(this->Data).Size;
    }
    lVar8 = uVar3 - (lVar10 >> 4);
    if (lVar8 != 0 && lVar10 >> 4 <= (long)uVar3) {
      memmove((void *)((long)__dest + lVar10 + 0x10),(void *)((long)__dest + lVar10),lVar8 * 0x10);
      __dest = (this->Data).Data;
    }
    *(ImGuiID *)((long)__dest + lVar10) = key;
    *(float *)((long)__dest + lVar10 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pPVar11 = (Pair *)(lVar10 + (long)(this->Data).Data);
  }
  return (float *)&pPVar11->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_f;
}